

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad_o1.cc
# Opt level: O3

VectorXd __thiscall lf::geometry::QuadO1::IntegrationElement(QuadO1 *this,MatrixXd *local)

{
  Index *pIVar1;
  Index IVar2;
  long lVar3;
  uint uVar4;
  int iVar5;
  CoeffReturnType pdVar6;
  Scalar *pSVar7;
  DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *in_RDX;
  Index extraout_RDX;
  long col;
  Scalar __x;
  VectorXd VVar8;
  MatrixXd jacobian;
  DstEvaluatorType dstEvaluator;
  SrcEvaluatorType srcEvaluator;
  assign_op<double,_double> local_5f9;
  DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *local_5f8;
  QuadO1 *local_5f0;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
  local_5e8;
  PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_5c8;
  Scalar local_5a8;
  DstEvaluatorType local_598;
  Rhs local_580;
  Lhs local_548;
  Lhs local_510;
  Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> local_4d8;
  MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_0> local_4a0;
  Index *local_488;
  undefined8 local_480;
  undefined8 uStack_478;
  Index local_470;
  undefined1 local_468 [24];
  PointerType local_450;
  Index local_440;
  PointerType local_438;
  Index local_428;
  double local_420;
  PointerType local_400;
  Index local_3f0;
  PointerType local_3e8;
  Index local_3d8;
  double local_3d0;
  undefined1 local_3b8 [16];
  PointerType local_3a8;
  XprTypeNested local_390;
  PointerType local_370;
  XprTypeNested local_358;
  scalar_constant_op<double> local_320;
  PointerType local_308;
  XprTypeNested local_2f0;
  PointerType local_2d0;
  XprTypeNested local_2b8;
  scalar_constant_op<double> local_280;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>_>
  local_260;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>_>
  local_1e8;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_170;
  double local_d0 [20];
  
  IVar2 = *(Index *)(in_RDX + 0x10);
  (this->super_Geometry)._vptr_Geometry = (_func_int **)0x0;
  (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_>.m_storage.m_data =
       (double *)0x0;
  local_5f8 = in_RDX;
  local_5f0 = this;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this,IVar2);
  uVar4 = (*(code *)(local->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                    m_storage.m_data[1])(local);
  local_5c8.m_storage.m_data = (double *)0x0;
  local_5c8.m_storage.m_rows = 0;
  local_5c8.m_storage.m_cols = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
            (&local_5c8,(ulong)uVar4,2);
  if (0 < *(long *)(local_5f8 + 0x10)) {
    pIVar1 = &(local->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
              m_rows;
    col = 0;
    do {
      lVar3 = (local->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
              m_cols;
      Eigen::MapBase<Eigen::Block<const_Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>,_0>::
      MapBase((MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_0> *
              )&local_510,
              (PointerType)
              (lVar3 * 8 +
              (local->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
              m_rows),lVar3,1);
      local_510.
      super_BlockImpl<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>.
      m_startRow.m_value = 0;
      local_510.
      super_BlockImpl<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>.
      m_startCol.m_value = 1;
      local_510.
      super_BlockImpl<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>.
      m_outerStride =
           (local->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
           m_cols;
      local_510.
      super_BlockImpl<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>.m_xpr =
           (XprTypeNested)pIVar1;
      Eigen::MapBase<Eigen::Block<const_Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>,_0>::
      MapBase(&local_4a0,
              (PointerType)
              (local->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
              m_rows,local_510.
                     super_BlockImpl<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>
                     .
                     super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>
                     .m_outerStride,1);
      local_480 = 0;
      uStack_478 = 0;
      local_470 = (local->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                  m_storage.m_cols;
      local_488 = pIVar1;
      Eigen::
      CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>_>
      ::CwiseBinaryOp(&local_1e8,&local_510,(Rhs *)&local_4a0,
                      (scalar_difference_op<double,_double> *)local_468);
      pdVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::operator()
                         (local_5f8,1,col);
      local_d0[0] = 1.0 - *pdVar6;
      Eigen::
      CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>
      ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                        *)local_468,
                       local_1e8.m_rhs.
                       super_BlockImpl<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>
                       .
                       super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>
                       .
                       super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_0>
                       .m_rows.m_value,1,(scalar_constant_op<double> *)local_d0);
      Eigen::
      CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
      ::CwiseBinaryOp(&local_170,&local_1e8,
                      (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                       *)local_468,(scalar_product_op<double,_double> *)&local_260);
      lVar3 = (local->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
              m_cols;
      Eigen::MapBase<Eigen::Block<const_Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>,_0>::
      MapBase((MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_0> *
              )&local_548,
              (PointerType)
              (lVar3 * 0x10 +
              (local->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
              m_rows),lVar3,1);
      local_548.
      super_BlockImpl<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>.
      m_startRow.m_value = 0;
      local_548.
      super_BlockImpl<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>.
      m_startCol.m_value = 2;
      local_548.
      super_BlockImpl<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>.
      m_outerStride =
           (local->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
           m_cols;
      local_548.
      super_BlockImpl<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>.m_xpr =
           (XprTypeNested)pIVar1;
      Eigen::MapBase<Eigen::Block<const_Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>,_0>::
      MapBase((MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_0> *
              )&local_580,
              (PointerType)
              (local_548.
               super_BlockImpl<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>
               .
               super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>
               .m_outerStride * 0x18 +
              (local->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
              m_rows),local_548.
                      super_BlockImpl<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>
                      .
                      super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>
                      .m_outerStride,1);
      local_580.
      super_BlockImpl<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>.
      m_startRow.m_value = 0;
      local_580.
      super_BlockImpl<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>.
      m_startCol.m_value = 3;
      local_580.
      super_BlockImpl<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>.
      m_outerStride =
           (local->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
           m_cols;
      local_580.
      super_BlockImpl<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>.m_xpr =
           (XprTypeNested)pIVar1;
      Eigen::
      CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>_>
      ::CwiseBinaryOp(&local_260,&local_548,&local_580,
                      (scalar_difference_op<double,_double> *)local_468);
      pdVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::operator()
                         (local_5f8,1,col);
      local_4d8.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
      .super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.m_data =
           (PointerType)*pdVar6;
      Eigen::
      CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>
      ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                        *)local_468,
                       local_260.m_rhs.
                       super_BlockImpl<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>
                       .
                       super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>
                       .
                       super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_0>
                       .m_rows.m_value,1,(scalar_constant_op<double> *)&local_4d8);
      Eigen::
      CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
      ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                       *)local_d0,&local_260,
                      (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                       *)local_468,(scalar_product_op<double,_double> *)&local_5e8);
      Eigen::
      CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>_>
      ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                       *)local_3b8,&local_170,
                      (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                       *)local_d0,(scalar_sum_op<double,_double> *)local_468);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
                (&local_4d8,(Matrix<double,__1,__1,_0,__1,__1> *)&local_5c8,0);
      local_450 = local_3a8;
      local_440 = (local_390->super_PlainObjectBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_>).
                  m_storage.m_rows;
      local_438 = local_370;
      local_428 = (local_358->super_PlainObjectBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_>).
                  m_storage.m_rows;
      local_420 = local_320.m_other;
      local_400 = local_308;
      local_3f0 = (local_2f0->super_PlainObjectBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_>).
                  m_storage.m_rows;
      local_3e8 = local_2d0;
      local_3d8 = (local_2b8->super_PlainObjectBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_>).
                  m_storage.m_rows;
      local_3d0 = local_280.m_other;
      Eigen::internal::
      resize_if_allowed<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,4,0,_1,4>const,_1,1,true>const,Eigen::Block<Eigen::Matrix<double,_1,4,0,_1,4>const,_1,1,true>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,4,0,_1,4>const,_1,1,true>const,Eigen::Block<Eigen::Matrix<double,_1,4,0,_1,4>const,_1,1,true>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>const>,double,double>
                (&local_4d8,
                 (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                  *)local_3b8,&local_5f9);
      local_598.super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
      super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
      .m_data = local_4d8.
                super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
                .super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
                super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>
                .
                super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>
                .m_data;
      local_598.super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
      super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
      .m_outerStride.m_value =
           ((local_4d8.
             super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
             super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
            m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
           m_rows;
      local_5e8.m_dst = &local_598;
      local_5e8.m_functor = &local_5f9;
      local_5e8.m_src = (SrcEvaluatorType *)local_468;
      local_5e8.m_dstExpr = &local_4d8;
      Eigen::internal::
      dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_3,_0>
      ::run(&local_5e8);
      IVar2 = (local->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
              m_cols;
      Eigen::MapBase<Eigen::Block<const_Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>,_0>::
      MapBase((MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_0> *
              )&local_510,
              (PointerType)
              (IVar2 * 0x18 +
              (local->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
              m_rows),IVar2,1);
      local_510.
      super_BlockImpl<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>.
      m_startRow.m_value = 0;
      local_510.
      super_BlockImpl<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>.
      m_startCol.m_value = 3;
      local_510.
      super_BlockImpl<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>.
      m_outerStride =
           (local->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
           m_cols;
      local_510.
      super_BlockImpl<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>.m_xpr =
           (XprTypeNested)pIVar1;
      Eigen::MapBase<Eigen::Block<const_Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>,_0>::
      MapBase(&local_4a0,
              (PointerType)
              (local->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
              m_rows,local_510.
                     super_BlockImpl<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>
                     .
                     super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>
                     .m_outerStride,1);
      local_480 = 0;
      uStack_478 = 0;
      local_470 = (local->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                  m_storage.m_cols;
      local_488 = pIVar1;
      Eigen::
      CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>_>
      ::CwiseBinaryOp(&local_1e8,&local_510,(Rhs *)&local_4a0,
                      (scalar_difference_op<double,_double> *)local_468);
      pdVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::operator()
                         (local_5f8,0,col);
      local_d0[0] = 1.0 - *pdVar6;
      Eigen::
      CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>
      ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                        *)local_468,
                       local_1e8.m_rhs.
                       super_BlockImpl<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>
                       .
                       super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>
                       .
                       super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_0>
                       .m_rows.m_value,1,(scalar_constant_op<double> *)local_d0);
      Eigen::
      CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
      ::CwiseBinaryOp(&local_170,&local_1e8,
                      (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                       *)local_468,(scalar_product_op<double,_double> *)&local_260);
      lVar3 = (local->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
              m_cols;
      Eigen::MapBase<Eigen::Block<const_Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>,_0>::
      MapBase((MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_0> *
              )&local_548,
              (PointerType)
              (lVar3 * 0x10 +
              (local->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
              m_rows),lVar3,1);
      local_548.
      super_BlockImpl<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>.
      m_startRow.m_value = 0;
      local_548.
      super_BlockImpl<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>.
      m_startCol.m_value = 2;
      local_548.
      super_BlockImpl<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>.
      m_outerStride =
           (local->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
           m_cols;
      local_548.
      super_BlockImpl<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>.m_xpr =
           (XprTypeNested)pIVar1;
      Eigen::MapBase<Eigen::Block<const_Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>,_0>::
      MapBase((MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_0> *
              )&local_580,
              (PointerType)
              (local_548.
               super_BlockImpl<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>
               .
               super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>
               .m_outerStride * 8 +
              (local->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
              m_rows),local_548.
                      super_BlockImpl<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>
                      .
                      super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>
                      .m_outerStride,1);
      local_580.
      super_BlockImpl<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>.
      m_startRow.m_value = 0;
      local_580.
      super_BlockImpl<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>.
      m_startCol.m_value = 1;
      local_580.
      super_BlockImpl<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>.
      m_outerStride =
           (local->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
           m_cols;
      local_580.
      super_BlockImpl<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>.m_xpr =
           (XprTypeNested)pIVar1;
      Eigen::
      CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>_>
      ::CwiseBinaryOp(&local_260,&local_548,&local_580,
                      (scalar_difference_op<double,_double> *)local_468);
      pdVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::operator()
                         (local_5f8,0,col);
      local_4d8.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
      .super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.m_data =
           (PointerType)*pdVar6;
      Eigen::
      CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>
      ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                        *)local_468,
                       local_260.m_rhs.
                       super_BlockImpl<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>
                       .
                       super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>
                       .
                       super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_0>
                       .m_rows.m_value,1,(scalar_constant_op<double> *)&local_4d8);
      Eigen::
      CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
      ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                       *)local_d0,&local_260,
                      (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                       *)local_468,(scalar_product_op<double,_double> *)&local_5e8);
      Eigen::
      CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>_>
      ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                       *)local_3b8,&local_170,
                      (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                       *)local_d0,(scalar_sum_op<double,_double> *)local_468);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
                (&local_4d8,(Matrix<double,__1,__1,_0,__1,__1> *)&local_5c8,1);
      local_450 = local_3a8;
      local_440 = (local_390->super_PlainObjectBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_>).
                  m_storage.m_rows;
      local_438 = local_370;
      local_428 = (local_358->super_PlainObjectBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_>).
                  m_storage.m_rows;
      local_420 = local_320.m_other;
      local_400 = local_308;
      local_3f0 = (local_2f0->super_PlainObjectBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_>).
                  m_storage.m_rows;
      local_3e8 = local_2d0;
      local_3d8 = (local_2b8->super_PlainObjectBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_>).
                  m_storage.m_rows;
      local_3d0 = local_280.m_other;
      Eigen::internal::
      resize_if_allowed<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,4,0,_1,4>const,_1,1,true>const,Eigen::Block<Eigen::Matrix<double,_1,4,0,_1,4>const,_1,1,true>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,4,0,_1,4>const,_1,1,true>const,Eigen::Block<Eigen::Matrix<double,_1,4,0,_1,4>const,_1,1,true>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>const>,double,double>
                (&local_4d8,
                 (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                  *)local_3b8,&local_5f9);
      local_598.super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
      super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
      .m_data = local_4d8.
                super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
                .super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
                super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>
                .
                super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>
                .m_data;
      local_598.super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
      super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
      .m_outerStride.m_value =
           ((local_4d8.
             super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
             super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
            m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
           m_rows;
      local_5e8.m_dst = &local_598;
      local_5e8.m_functor = &local_5f9;
      local_5e8.m_src = (SrcEvaluatorType *)local_468;
      local_5e8.m_dstExpr = &local_4d8;
      Eigen::internal::
      dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_3,_0>
      ::run(&local_5e8);
      iVar5 = (*(code *)(local->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                        m_storage.m_data[1])(local);
      if (iVar5 == 2) {
        local_5a8 = Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::determinant
                              ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_5c8);
        pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_5f0,
                            col);
        *pSVar7 = ABS(local_5a8);
      }
      else {
        local_170._0_8_ = &local_5c8;
        Eigen::
        Product<Eigen::Transpose<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>
        ::Product((Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>
                   *)local_3b8,(Lhs *)&local_170,(Rhs *)local_170._0_8_);
        local_468._0_8_ = local_3b8._0_8_;
        local_468._8_8_ = local_3b8._8_8_;
        __x = Eigen::
              MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>_>
              ::determinant((MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
                             *)local_468);
        if (__x < 0.0) {
          local_5a8 = sqrt(__x);
        }
        else {
          local_5a8 = SQRT(__x);
        }
        pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_5f0,
                            col);
        *pSVar7 = local_5a8;
      }
      col = col + 1;
    } while (col < *(long *)(local_5f8 + 0x10));
  }
  free(local_5c8.m_storage.m_data);
  VVar8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       extraout_RDX;
  VVar8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)local_5f0;
  return (VectorXd)VVar8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

Eigen::VectorXd QuadO1::IntegrationElement(const Eigen::MatrixXd& local) const {
  Eigen::VectorXd result(local.cols());
  Eigen::MatrixXd jacobian(DimGlobal(), 2);

  // Loop over all evaluatin points
  for (Eigen::Index i = 0; i < local.cols(); ++i) {
    // Compute Jacobian matrix in one evaluation point.
    jacobian.col(0) = (coords_.col(1) - coords_.col(0)) * (1 - local(1, i)) +
                      (coords_.col(2) - coords_.col(3)) * local(1, i);
    jacobian.col(1) = (coords_.col(3) - coords_.col(0)) * (1 - local(0, i)) +
                      (coords_.col(2) - coords_.col(1)) * local(0, i);
    // For planar cell, simply the determinant, for a cell in 3D space, the
    // volume form
    if (DimGlobal() == 2) {
      result(i) = std::abs(jacobian.determinant());
    } else {
      result(i) = std::sqrt((jacobian.transpose() * jacobian).determinant());
    }
  }
  return result;
}